

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil.c
# Opt level: O1

int evutil_getaddrinfo(char *nodename,char *servname,addrinfo *hints_in,addrinfo **res)

{
  sockaddr *psVar1;
  ushort uVar2;
  ushort uVar3;
  sockaddr *psVar4;
  addrinfo *paVar5;
  socklen_t sVar6;
  undefined4 uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  sockaddr_in6 *sin6;
  addrinfo *paVar13;
  addrinfo *paVar14;
  addrinfo **ppaVar15;
  bool bVar16;
  int portnum;
  int local_5c;
  addrinfo local_58;
  
  local_5c = -1;
  if (hints_in == (addrinfo *)0x0) {
    local_58.ai_flags = 0;
    local_58.ai_family = 0;
    local_58.ai_socktype = 0;
    local_58.ai_protocol = 0;
    local_58.ai_canonname = (char *)0x0;
    local_58.ai_next = (addrinfo *)0x0;
    local_58.ai_addrlen = 0;
    local_58._20_4_ = 0;
    local_58.ai_addr = (sockaddr *)0x0;
  }
  else {
    local_58.ai_flags = hints_in->ai_flags;
    local_58.ai_family = hints_in->ai_family;
    local_58.ai_socktype = hints_in->ai_socktype;
    local_58.ai_protocol = hints_in->ai_protocol;
    local_58.ai_addrlen = hints_in->ai_addrlen;
    local_58._20_4_ = *(undefined4 *)&hints_in->field_0x14;
    local_58.ai_addr = hints_in->ai_addr;
    local_58.ai_canonname = hints_in->ai_canonname;
    local_58.ai_next = hints_in->ai_next;
  }
  if (tested_for_getaddrinfo_hacks == '\0') {
    test_for_getaddrinfo_hacks();
  }
  bVar16 = false;
  if (((servname != (char *)0x0) && (bVar16 = false, (need_numeric_port_hack_ & 1) != 0)) &&
     (local_58.ai_socktype == 0)) {
    local_5c = parse_numeric_servname(servname);
    bVar16 = -1 < local_5c;
  }
  if (bVar16) {
    if (nodename == (char *)0x0) {
      iVar12 = evutil_getaddrinfo_common_((char *)0x0,servname,&local_58,res,&local_5c);
      return iVar12;
    }
    servname = (char *)0x0;
  }
  if (tested_for_getaddrinfo_hacks == '\0') {
    test_for_getaddrinfo_hacks();
  }
  if (need_socktype_protocol_hack_ == '\x01') {
    if (local_58.ai_protocol == 0) {
      if (local_58.ai_socktype == 2) {
        local_58.ai_protocol = 0x11;
      }
      else if (local_58.ai_socktype == 1) {
        local_58.ai_protocol = 6;
      }
    }
    if (local_58.ai_socktype == 0) {
      if (local_58.ai_protocol != 0x84) {
        if (local_58.ai_protocol == 0x11) {
          local_58.ai_socktype = 2;
          goto LAB_002dcd90;
        }
        if (local_58.ai_protocol != 6) goto LAB_002dcd90;
      }
      local_58.ai_socktype = 1;
    }
  }
LAB_002dcd90:
  local_58.ai_flags = local_58.ai_flags & 0x7fffffff;
  iVar12 = getaddrinfo(nodename,servname,(addrinfo *)&local_58,(addrinfo **)res);
  if ((bVar16) && (paVar14 = *res, paVar14 != (addrinfo *)0x0)) {
    uVar2 = (ushort)local_5c << 8;
    uVar3 = (ushort)local_5c >> 8;
    ppaVar15 = res;
    do {
      psVar1 = ((addrinfo *)paVar14)->ai_addr;
      if ((psVar1 == (sockaddr *)0x0) || ((psVar1->sa_family != 10 && (psVar1->sa_family != 2)))) {
        *ppaVar15 = (addrinfo *)((addrinfo *)paVar14)->ai_next;
        ((addrinfo *)paVar14)->ai_next = (addrinfo *)0x0;
        freeaddrinfo((addrinfo *)paVar14);
      }
      else {
        *(ushort *)psVar1->sa_data = uVar2 | uVar3;
      }
      paVar14 = (*ppaVar15)->ai_next;
      ppaVar15 = &(*ppaVar15)->ai_next;
    } while (paVar14 != (addrinfo *)0x0);
  }
  if (tested_for_getaddrinfo_hacks == '\0') {
    test_for_getaddrinfo_hacks();
  }
  if (need_socktype_protocol_hack_ == '\x01') {
    for (paVar14 = *res; paVar14 != (addrinfo *)0x0; paVar14 = paVar14->ai_next) {
      evutil_getaddrinfo_infer_protocols(paVar14);
      if ((paVar14->ai_socktype == 0) && (paVar14->ai_protocol == 0)) {
        paVar13 = (addrinfo *)event_mm_malloc_(0x30);
        if (paVar13 == (addrinfo *)0x0) {
          evutil_freeaddrinfo(*res);
          *res = (addrinfo *)0x0;
          return -10;
        }
        iVar8 = paVar14->ai_flags;
        iVar9 = paVar14->ai_family;
        iVar10 = paVar14->ai_socktype;
        iVar11 = paVar14->ai_protocol;
        sVar6 = paVar14->ai_addrlen;
        uVar7 = *(undefined4 *)&paVar14->field_0x14;
        psVar4 = paVar14->ai_addr;
        paVar5 = paVar14->ai_next;
        paVar13->ai_canonname = paVar14->ai_canonname;
        paVar13->ai_next = paVar5;
        paVar13->ai_addrlen = sVar6;
        *(undefined4 *)&paVar13->field_0x14 = uVar7;
        paVar13->ai_addr = psVar4;
        paVar13->ai_flags = iVar8;
        paVar13->ai_family = iVar9;
        paVar13->ai_socktype = iVar10;
        paVar13->ai_protocol = iVar11;
        paVar14->ai_socktype = 1;
        paVar14->ai_protocol = 6;
        paVar13->ai_socktype = 2;
        paVar13->ai_protocol = 0x11;
        paVar13->ai_next = paVar14->ai_next;
        paVar14->ai_next = paVar13;
      }
    }
  }
  return iVar12;
}

Assistant:

int
evutil_getaddrinfo(const char *nodename, const char *servname,
    const struct evutil_addrinfo *hints_in, struct evutil_addrinfo **res)
{
#ifdef USE_NATIVE_GETADDRINFO
	struct evutil_addrinfo hints;
	int portnum=-1, need_np_hack, err;

	if (hints_in) {
		memcpy(&hints, hints_in, sizeof(hints));
	} else {
		memset(&hints, 0, sizeof(hints));
		hints.ai_family = PF_UNSPEC;
	}

#ifndef AI_ADDRCONFIG
	/* Not every system has AI_ADDRCONFIG, so fake it. */
	if (hints.ai_family == PF_UNSPEC &&
	    (hints.ai_flags & EVUTIL_AI_ADDRCONFIG)) {
		evutil_adjust_hints_for_addrconfig_(&hints);
	}
#endif

#ifndef AI_NUMERICSERV
	/* Not every system has AI_NUMERICSERV, so fake it. */
	if (hints.ai_flags & EVUTIL_AI_NUMERICSERV) {
		if (servname && parse_numeric_servname(servname)<0)
			return EVUTIL_EAI_NONAME;
	}
#endif

	/* Enough operating systems handle enough common non-resolve
	 * cases here weirdly enough that we are better off just
	 * overriding them.  For example:
	 *
	 * - Windows doesn't like to infer the protocol from the
	 *   socket type, or fill in socket or protocol types much at
	 *   all.  It also seems to do its own broken implicit
	 *   always-on version of AI_ADDRCONFIG that keeps it from
	 *   ever resolving even a literal IPv6 address when
	 *   ai_addrtype is PF_UNSPEC.
	 */
#ifdef _WIN32
	{
		int tmp_port;
		err = evutil_getaddrinfo_common_(nodename,servname,&hints,
		    res, &tmp_port);
		if (err == 0 ||
		    err == EVUTIL_EAI_MEMORY ||
		    err == EVUTIL_EAI_NONAME)
			return err;
		/* If we make it here, the system getaddrinfo can
		 * have a crack at it. */
	}
#endif

	/* See documentation for need_numeric_port_hack above.*/
	need_np_hack = need_numeric_port_hack() && servname && !hints.ai_socktype
	    && ((portnum=parse_numeric_servname(servname)) >= 0);
	if (need_np_hack) {
		if (!nodename)
			return evutil_getaddrinfo_common_(
				NULL,servname,&hints, res, &portnum);
		servname = NULL;
	}

	if (need_socktype_protocol_hack()) {
		evutil_getaddrinfo_infer_protocols(&hints);
	}

	/* Make sure that we didn't actually steal any AI_FLAGS values that
	 * the system is using.  (This is a constant expression, and should ge
	 * optimized out.)
	 *
	 * XXXX Turn this into a compile-time failure rather than a run-time
	 * failure.
	 */
	EVUTIL_ASSERT((ALL_NONNATIVE_AI_FLAGS & ALL_NATIVE_AI_FLAGS) == 0);

	/* Clear any flags that only libevent understands. */
	hints.ai_flags &= ~ALL_NONNATIVE_AI_FLAGS;

	err = getaddrinfo(nodename, servname, &hints, res);
	if (need_np_hack)
		apply_numeric_port_hack(portnum, res);

	if (need_socktype_protocol_hack()) {
		if (apply_socktype_protocol_hack(*res) < 0) {
			evutil_freeaddrinfo(*res);
			*res = NULL;
			return EVUTIL_EAI_MEMORY;
		}
	}
	return err;
#else
	int port=0, err;
	struct hostent *ent = NULL;
	struct evutil_addrinfo hints;

	if (hints_in) {
		memcpy(&hints, hints_in, sizeof(hints));
	} else {
		memset(&hints, 0, sizeof(hints));
		hints.ai_family = PF_UNSPEC;
	}

	evutil_adjust_hints_for_addrconfig_(&hints);

	err = evutil_getaddrinfo_common_(nodename, servname, &hints, res, &port);
	if (err != EVUTIL_EAI_NEED_RESOLVE) {
		/* We either succeeded or failed.  No need to continue */
		return err;
	}

	err = 0;
	/* Use any of the various gethostbyname_r variants as available. */
	{
#ifdef EVENT__HAVE_GETHOSTBYNAME_R_6_ARG
		/* This one is what glibc provides. */
		char buf[2048];
		struct hostent hostent;
		int r;
		r = gethostbyname_r(nodename, &hostent, buf, sizeof(buf), &ent,
		    &err);
#elif defined(EVENT__HAVE_GETHOSTBYNAME_R_5_ARG)
		char buf[2048];
		struct hostent hostent;
		ent = gethostbyname_r(nodename, &hostent, buf, sizeof(buf),
		    &err);
#elif defined(EVENT__HAVE_GETHOSTBYNAME_R_3_ARG)
		struct hostent_data data;
		struct hostent hostent;
		memset(&data, 0, sizeof(data));
		err = gethostbyname_r(nodename, &hostent, &data);
		ent = err ? NULL : &hostent;
#else
		/* fall back to gethostbyname. */
		/* XXXX This needs a lock everywhere but Windows. */
		ent = gethostbyname(nodename);
#ifdef _WIN32
		err = WSAGetLastError();
#else
		err = h_errno;
#endif
#endif

		/* Now we have either ent or err set. */
		if (!ent) {
			/* XXX is this right for windows ? */
			switch (err) {
			case TRY_AGAIN:
				return EVUTIL_EAI_AGAIN;
			case NO_RECOVERY:
			default:
				return EVUTIL_EAI_FAIL;
			case HOST_NOT_FOUND:
				return EVUTIL_EAI_NONAME;
			case NO_ADDRESS:
#if NO_DATA != NO_ADDRESS
			case NO_DATA:
#endif
				return EVUTIL_EAI_NODATA;
			}
		}

		if (ent->h_addrtype != hints.ai_family &&
		    hints.ai_family != PF_UNSPEC) {
			/* This wasn't the type we were hoping for.  Too bad
			 * we never had a chance to ask gethostbyname for what
			 * we wanted. */
			return EVUTIL_EAI_NONAME;
		}

		/* Make sure we got _some_ answers. */
		if (ent->h_length == 0)
			return EVUTIL_EAI_NODATA;

		/* If we got an address type we don't know how to make a
		   sockaddr for, give up. */
		if (ent->h_addrtype != PF_INET && ent->h_addrtype != PF_INET6)
			return EVUTIL_EAI_FAMILY;

		*res = addrinfo_from_hostent(ent, port, &hints);
		if (! *res)
			return EVUTIL_EAI_MEMORY;
	}

	return 0;
#endif
}